

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall
glslang::TPpContext::extraTokenCheck(TPpContext *this,int contextAtom,TPpToken *ppToken,int token)

{
  bool bVar1;
  char *local_30;
  char *label;
  int token_local;
  TPpToken *ppToken_local;
  int contextAtom_local;
  TPpContext *this_local;
  
  label._4_4_ = token;
  if ((token != 10) && (token != -1)) {
    if (contextAtom == 0xa8) {
      local_30 = "#else";
    }
    else if (contextAtom == 0xa9) {
      local_30 = "#elif";
    }
    else if (contextAtom == 0xaa) {
      local_30 = "#endif";
    }
    else if (contextAtom == 0xa5) {
      local_30 = "#if";
    }
    else if (contextAtom == 0xab) {
      local_30 = "#line";
    }
    else {
      local_30 = "";
    }
    bVar1 = TParseVersions::relaxedErrors(&this->parseContext->super_TParseVersions);
    if (bVar1) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x30])
                (this->parseContext,ppToken,extraTokenCheck::message,local_30,"");
    }
    else {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,extraTokenCheck::message,local_30,"");
    }
    while (label._4_4_ != 10 && label._4_4_ != -1) {
      label._4_4_ = scanToken(this,ppToken);
    }
  }
  return label._4_4_;
}

Assistant:

int TPpContext::extraTokenCheck(int contextAtom, TPpToken* ppToken, int token)
{
    if (token != '\n' && token != EndOfInput) {
        static const char* message = "unexpected tokens following directive";

        const char* label;
        if (contextAtom == PpAtomElse)
            label = "#else";
        else if (contextAtom == PpAtomElif)
            label = "#elif";
        else if (contextAtom == PpAtomEndif)
            label = "#endif";
        else if (contextAtom == PpAtomIf)
            label = "#if";
        else if (contextAtom == PpAtomLine)
            label = "#line";
        else
            label = "";

        if (parseContext.relaxedErrors())
            parseContext.ppWarn(ppToken->loc, message, label, "");
        else
            parseContext.ppError(ppToken->loc, message, label, "");

        while (token != '\n' && token != EndOfInput)
            token = scanToken(ppToken);
    }

    return token;
}